

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::setDataLocations(GLShaderProgram *this)

{
  GLuint GVar1;
  PFNGLGETATTRIBLOCATIONPROC p_Var2;
  PFNGLGETUNIFORMLOCATIONPROC p_Var3;
  bool bVar4;
  GLint GVar5;
  reference pGVar6;
  GLchar *pGVar7;
  runtime_error *prVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  GLShaderTexture *t;
  iterator __end2_2;
  iterator __begin2_2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
  *__range2_2;
  GLShaderAttribute *a;
  iterator __end2_1;
  iterator __begin2_1;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  *__range2_1;
  GLShaderUniform *u;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
  *__range2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  GLuint in_stack_fffffffffffffed4;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  undefined1 uVar9;
  string local_e0 [32];
  reference local_c0;
  GLShaderTexture *local_b8;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_99;
  string local_98 [31];
  undefined1 in_stack_ffffffffffffff87;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>_>
  local_68;
  size_type *local_60;
  undefined1 local_55;
  string local_48 [32];
  reference local_28;
  GLShaderUniform *local_20;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>_>
  local_18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_10;
  
  (*glad_glUseProgram)(*(GLuint *)((long)&in_RDI[3].field_2 + 8));
  local_10 = &in_RDI[1].field_2;
  local_18._M_current =
       (GLShaderUniform *)
       std::
       vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
       ::begin((vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
                *)in_stack_fffffffffffffec8);
  local_20 = (GLShaderUniform *)
             std::
             vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
             ::end((vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
                    *)in_stack_fffffffffffffec8);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>_>
                        *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>_>
                        *)in_stack_fffffffffffffec8);
    if (!bVar4) break;
    local_28 = __gnu_cxx::
               __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>_>
               ::operator*(&local_18);
    p_Var3 = glad_glGetUniformLocation;
    GVar1 = *(GLuint *)((long)&in_RDI[3].field_2 + 8);
    pGVar7 = (GLchar *)std::__cxx11::string::c_str();
    GVar5 = (*p_Var3)(GVar1,pGVar7);
    local_28->location = GVar5;
    if (local_28->location == -1) {
      local_55 = 1;
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),in_RDI);
      std::runtime_error::runtime_error(prVar8,local_48);
      local_55 = 0;
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>_>
    ::operator++(&local_18);
  }
  local_60 = &in_RDI[2]._M_string_length;
  local_68._M_current =
       (GLShaderAttribute *)
       std::
       vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
       ::begin(in_stack_fffffffffffffec8);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  ::end(in_stack_fffffffffffffec8);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>_>
                        *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>_>
                        *)in_stack_fffffffffffffec8);
    if (!bVar4) break;
    pGVar6 = __gnu_cxx::
             __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>_>
             ::operator*(&local_68);
    p_Var2 = glad_glGetAttribLocation;
    GVar1 = *(GLuint *)((long)&in_RDI[3].field_2 + 8);
    pGVar7 = (GLchar *)std::__cxx11::string::c_str();
    GVar5 = (*p_Var2)(GVar1,pGVar7);
    pGVar6->location = GVar5;
    if (pGVar6->location == -1) {
      local_99 = 1;
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),in_RDI);
      std::runtime_error::runtime_error(prVar8,local_98);
      local_99 = 0;
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>_>
    ::operator++(&local_68);
  }
  local_a8 = in_RDI + 3;
  local_b0._M_current =
       (GLShaderTexture *)
       std::
       vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
       ::begin((vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
                *)in_stack_fffffffffffffec8);
  local_b8 = (GLShaderTexture *)
             std::
             vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
             ::end((vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
                    *)in_stack_fffffffffffffec8);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>_>
                        *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>_>
                        *)in_stack_fffffffffffffec8);
    if (!bVar4) {
      checkGLError((bool)in_stack_ffffffffffffff87);
      return;
    }
    local_c0 = __gnu_cxx::
               __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>_>
               ::operator*(&local_b0);
    p_Var3 = glad_glGetUniformLocation;
    in_stack_fffffffffffffed4 = *(GLuint *)((long)&in_RDI[3].field_2 + 8);
    pGVar7 = (GLchar *)std::__cxx11::string::c_str();
    GVar5 = (*p_Var3)(in_stack_fffffffffffffed4,pGVar7);
    local_c0->location = GVar5;
    if (local_c0->location == -1) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>_>
    ::operator++(&local_b0);
  }
  uVar9 = 1;
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((char *)CONCAT17(uVar9,in_stack_ffffffffffffff18),in_RDI);
  std::runtime_error::runtime_error(prVar8,local_e0);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GLShaderProgram::setDataLocations() {
  glUseProgram(programHandle);

  // Uniforms
  for (GLShaderUniform& u : uniforms) {
    u.location = glGetUniformLocation(programHandle, u.name.c_str());
    if (u.location == -1) throw std::runtime_error("failed to get location for uniform " + u.name);
  }

  // Attributes
  for (GLShaderAttribute& a : attributes) {
    a.location = glGetAttribLocation(programHandle, a.name.c_str());
    if (a.location == -1) throw std::runtime_error("failed to get location for attribute " + a.name);
  }

  // Textures
  for (GLShaderTexture& t : textures) {
    t.location = glGetUniformLocation(programHandle, t.name.c_str());
    if (t.location == -1) throw std::runtime_error("failed to get location for texture " + t.name);
  }

  checkGLError();
}